

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

string * google::ShellEscape(string *__return_storage_ptr__,string *src)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  undefined8 local_38;
  size_t i;
  string *src_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (lVar3 = std::__cxx11::string::find_first_not_of((char *)src,0x1441d0), lVar3 == -1)) {
    std::__cxx11::string::assign((string *)__return_storage_ptr__);
  }
  else {
    lVar3 = std::__cxx11::string::find_first_of((char)src,0x27);
    if (lVar3 == -1) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      for (local_38 = 0; uVar2 = std::__cxx11::string::size(), local_38 < uVar2;
          local_38 = local_38 + 1) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)src);
        cVar1 = *pcVar4;
        if ((((cVar1 == '\"') || (cVar1 == '$')) || (cVar1 == '\\')) || (cVar1 == '`')) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)src,local_38);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static string ShellEscape(const string& src) {
  string result;
  if (!src.empty() &&  // empty string needs quotes
      src.find_first_not_of(kDontNeedShellEscapeChars) == string::npos) {
    // only contains chars that don't need quotes; it's fine
    result.assign(src);
  } else if (src.find_first_of('\'') == string::npos) {
    // no single quotes; just wrap it in single quotes
    result.assign("'");
    result.append(src);
    result.append("'");
  } else {
    // needs double quote escaping
    result.assign("\"");
    for (size_t i = 0; i < src.size(); ++i) {
      switch (src[i]) {
        case '\\':
        case '$':
        case '"':
        case '`':
          result.append("\\");
      }
      result.append(src, i, 1);
    }
    result.append("\"");
  }
  return result;
}